

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O2

unsigned_short __thiscall
pstore::serialize::archive::buffer_reader::get<unsigned_short>(buffer_reader *this)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  
  puVar1 = (unsigned_short *)((long)this->first_ + 2);
  if (puVar1 <= this->last_) {
    uVar2 = *(unsigned_short *)this->first_;
    this->first_ = (uint8_t *)puVar1;
    return uVar2;
  }
  raise<std::errc,char[44]>
            (no_buffer_space,(char (*) [44])"Attempted to read past the end of a buffer.");
}

Assistant:

T get () {
                    typename std::remove_const<T>::type result;
                    static_assert (std::is_standard_layout<T>::value,
                                   "buffer_reader(T&) can only read standard-layout types");
                    if (first_ + sizeof (T) > last_) {
                        raise (std::errc::no_buffer_space,
                               "Attempted to read past the end of a buffer.");
                    }
                    std::memcpy (&result, first_, sizeof (T));
                    first_ += sizeof (T);
                    return result;
                }